

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

void column_test_boundary_chain_methods<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                *matrix)

{
  pointer pIVar1;
  undefined1 *puVar2;
  Dimension DVar3;
  undefined4 local_3b8;
  Dimension local_3b4;
  undefined **local_3b0;
  undefined1 local_3a8;
  undefined8 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x358);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2d8 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&(pIVar1->column_).super_type.data_.root_plus_size_;
  DVar3 = -1;
  local_3b4 = DVar3;
  if ((Column_support *)puVar2 != &pIVar1->column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 &(*(node_ptr *)((long)&(pIVar1->column_).super_type.data_ + 8))[1].next_;
  }
  local_3b8 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_3b0,&local_2e0,0x358,1,2,&local_3b4,"matrix[0].get_pivot()",&local_3b8,"5",
             0xffffffffffffffff);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x359);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2e8 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[1].column_.super_type.data_.root_plus_size_;
  local_3b4 = DVar3;
  if ((Column_support *)puVar2 != &pIVar1[1].column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 &(*(node_ptr *)((long)&pIVar1[1].column_.super_type.data_ + 8))[1].next_;
  }
  local_3b8 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_3b0,&local_2f0,0x359,1,2,&local_3b4,"matrix[1].get_pivot()",&local_3b8,"6");
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x35a);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2f8 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[2].column_.super_type.data_.root_plus_size_;
  local_3b4 = DVar3;
  if ((Column_support *)puVar2 != &pIVar1[2].column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 &(*(node_ptr *)((long)&pIVar1[2].column_.super_type.data_ + 8))[1].next_;
  }
  local_3b8 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_3b0,&local_300,0x35a,1,2,&local_3b4,"matrix[2].get_pivot()",&local_3b8,"6");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x35b);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_308 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[3].column_.super_type.data_.root_plus_size_;
  local_3b4 = DVar3;
  if ((Column_support *)puVar2 != &pIVar1[3].column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 &(*(node_ptr *)((long)&pIVar1[3].column_.super_type.data_ + 8))[1].next_;
  }
  local_3b8 = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_3b0,&local_310,0x35b,1,2,&local_3b4,"matrix[3].get_pivot()",&local_3b8,"-1");
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x35c);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_318 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[4].column_.super_type.data_.root_plus_size_;
  local_3b4 = DVar3;
  if ((Column_support *)puVar2 != &pIVar1[4].column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 &(*(node_ptr *)((long)&pIVar1[4].column_.super_type.data_ + 8))[1].next_;
  }
  local_3b8 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_3b0,&local_320,0x35c,1,2,&local_3b4,"matrix[4].get_pivot()",&local_3b8,"5");
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x35d);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_328 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[5].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)puVar2 != &pIVar1[5].column_ && puVar2 != (undefined1 *)0x0) {
    DVar3 = *(Dimension *)&(*(node_ptr *)((long)&pIVar1[5].column_.super_type.data_ + 8))[1].next_;
  }
  local_3b8 = 6;
  local_3b4 = DVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_3b0,&local_330,0x35d,1,2,&local_3b4,"matrix[5].get_pivot()",&local_3b8,"6");
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x360);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_338 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&(pIVar1->column_).super_type.data_.root_plus_size_;
  DVar3 = 0;
  local_3b4 = 0;
  if ((Column_support *)puVar2 != &pIVar1->column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 ((long)&(*(node_ptr *)((long)&(pIVar1->column_).super_type.data_ + 8))[-2].prev_ +
                 4);
  }
  local_3b8 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_3b0,&local_340,0x360,1,2,&local_3b4,"matrix[0].get_pivot_value()",&local_3b8,
             "4u");
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x361);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_348 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[1].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)puVar2 != &pIVar1[1].column_ && puVar2 != (undefined1 *)0x0) {
    DVar3 = *(Dimension *)
             ((long)&(*(node_ptr *)((long)&pIVar1[1].column_.super_type.data_ + 8))[-2].prev_ + 4);
  }
  local_3b8 = 1;
  local_3b4 = DVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_3b0,&local_350,0x361,1,2,&local_3b4,"matrix[1].get_pivot_value()",&local_3b8,
             "1u");
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x362);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_358 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[2].column_.super_type.data_.root_plus_size_;
  DVar3 = 0;
  local_3b4 = 0;
  if ((Column_support *)puVar2 != &pIVar1[2].column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 ((long)&(*(node_ptr *)((long)&pIVar1[2].column_.super_type.data_ + 8))[-2].prev_ +
                 4);
  }
  local_3b8 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_3b0,&local_360,0x362,1,2,&local_3b4,"matrix[2].get_pivot_value()",&local_3b8,
             "4u");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x363);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_368 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[3].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)puVar2 != &pIVar1[3].column_ && puVar2 != (undefined1 *)0x0) {
    DVar3 = *(Dimension *)
             ((long)&(*(node_ptr *)((long)&pIVar1[3].column_.super_type.data_ + 8))[-2].prev_ + 4);
  }
  local_3b8 = 0;
  local_3b4 = DVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_3b0,&local_370,0x363,1,2,&local_3b4,"matrix[3].get_pivot_value()",&local_3b8,
             "0u");
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x364);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_378 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[4].column_.super_type.data_.root_plus_size_;
  DVar3 = 0;
  local_3b4 = 0;
  if ((Column_support *)puVar2 != &pIVar1[4].column_ && puVar2 != (undefined1 *)0x0) {
    local_3b4 = *(Dimension *)
                 ((long)&(*(node_ptr *)((long)&pIVar1[4].column_.super_type.data_ + 8))[-2].prev_ +
                 4);
  }
  local_3b8 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_3b0,&local_380,0x364,1,2,&local_3b4,"matrix[4].get_pivot_value()",&local_3b8,
             "4u");
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x365);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_388 = "";
  pIVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[5].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)puVar2 != &pIVar1[5].column_ && puVar2 != (undefined1 *)0x0) {
    DVar3 = *(Dimension *)
             ((long)&(*(node_ptr *)((long)&pIVar1[5].column_.super_type.data_ + 8))[-2].prev_ + 4);
  }
  local_3b8 = 1;
  local_3b4 = DVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_3b0,&local_390,0x365,1,2,&local_3b4,"matrix[5].get_pivot_value()",&local_3b8,
             "1u");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x368);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  local_3b4 = (((matrix->
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_3b8 = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_3b0,&local_1e0,0x368,1,2,&local_3b4,"matrix[0].get_dimension()",&local_3b8,"4");
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x369);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_208 = "";
  local_3b4 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_3b8 = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_3b0,&local_210,0x369,1,2,&local_3b4,"matrix[1].get_dimension()",&local_3b8,"4");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x36a);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_238 = "";
  local_3b4 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_3b8 = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_3b0,&local_240,0x36a,1,2,&local_3b4,"matrix[2].get_dimension()",&local_3b8,"4");
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x36b);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_268 = "";
  local_3b4 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_3b8 = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_3b0,&local_270,0x36b,1,2,&local_3b4,"matrix[3].get_dimension()",&local_3b8,"4");
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x36c);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_298 = "";
  local_3b4 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_3b8 = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_3b0,&local_2a0,0x36c,1,2,&local_3b4,"matrix[4].get_dimension()",&local_3b8,"4");
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x36d);
  local_3a8 = 0;
  local_3b0 = &PTR__lazy_ostream_00208420;
  local_3a0 = &boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2c8 = "";
  local_3b4 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_3b8 = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_3b0,&local_2d0,0x36d,1,2,&local_3b4,"matrix[5].get_dimension()",&local_3b8,"4");
  return;
}

Assistant:

void column_test_boundary_chain_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[1].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[2].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[3].get_pivot(), -1);
  BOOST_CHECK_EQUAL(matrix[4].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[5].get_pivot(), 6);

  if constexpr (!is_z2<Column>()) {
    BOOST_CHECK_EQUAL(matrix[0].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[1].get_pivot_value(), 1u);
    BOOST_CHECK_EQUAL(matrix[2].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[3].get_pivot_value(), 0u);
    BOOST_CHECK_EQUAL(matrix[4].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[5].get_pivot_value(), 1u);
  }

  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}